

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particles.cpp
# Opt level: O1

void __thiscall CParticles::CParticles(CParticles *this)

{
  long lVar1;
  int iVar2;
  
  (this->super_CComponent)._vptr_CComponent = (_func_int **)&PTR__CParticles_00214778;
  (this->m_RenderTrail).super_CComponent._vptr_CComponent = (_func_int **)&PTR__CComponent_00214810;
  (this->m_RenderExplosions).super_CComponent._vptr_CComponent =
       (_func_int **)&PTR__CComponent_002148a8;
  (this->m_RenderGeneral).super_CComponent._vptr_CComponent =
       (_func_int **)&PTR__CComponent_00214940;
  lVar1 = 0x5c;
  iVar2 = 1;
  do {
    *(int *)((long)this->m_aParticles + lVar1 + -0x14) = iVar2 + -2;
    *(int *)((long)this->m_aParticles + lVar1 + -0x10) = iVar2;
    lVar1 = lVar1 + 0x50;
    iVar2 = iVar2 + 1;
  } while (lVar1 != 0xa005c);
  this->m_aParticles[0].m_PrevPart = 0;
  *(undefined8 *)&this->m_aParticles[0x1fff].m_NextPart = 0xffffffff;
  this->m_aFirstPart[0] = -1;
  this->m_aFirstPart[1] = -1;
  this->m_aFirstPart[2] = -1;
  (this->m_RenderTrail).m_pParts = this;
  (this->m_RenderExplosions).m_pParts = this;
  (this->m_RenderGeneral).m_pParts = this;
  return;
}

Assistant:

CParticles::CParticles()
{
	OnReset();
	m_RenderTrail.m_pParts = this;
	m_RenderExplosions.m_pParts = this;
	m_RenderGeneral.m_pParts = this;
}